

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O2

void __thiscall NavierStokesBase::init_additional_state_types(NavierStokesBase *this)

{
  bool bVar1;
  ostream *poVar2;
  Print *pPVar3;
  int _Dsdt;
  int _Divu;
  allocator local_19d;
  int dummy_Dsdt_Type;
  int dummy_Divu_Type;
  int dummy_State_Type;
  Print local_190;
  
  additional_state_types_initialized = 1;
  std::__cxx11::string::string((string *)&local_190,"temp",(allocator *)&_Divu);
  amrex::AmrLevel::isStateVariable((string *)&local_190,&dummy_State_Type,&Temp);
  std::__cxx11::string::~string((string *)&local_190);
  _Divu = -1;
  have_divu = 0;
  std::__cxx11::string::string((string *)&local_190,"divu",(allocator *)&_Dsdt);
  bVar1 = amrex::AmrLevel::isStateVariable((string *)&local_190,&dummy_Divu_Type,&_Divu);
  have_divu = (int)bVar1;
  std::__cxx11::string::~string((string *)&local_190);
  bVar1 = dummy_Divu_Type == Divu_Type && have_divu != 0;
  have_divu = (int)bVar1;
  if (verbose != 0) {
    poVar2 = amrex::OutStream();
    amrex::Print::Print(&local_190,poVar2);
    std::operator<<((ostream *)&local_190.ss,
                    "NavierStokesBase::init_additional_state_types()::have_divu = ");
    pPVar3 = amrex::Print::operator<<(&local_190,&have_divu);
    std::operator<<((ostream *)&pPVar3->ss,'\n');
    amrex::Print::~Print(&local_190);
    bVar1 = have_divu != 0;
  }
  if ((bVar1) && (_Divu != 0)) {
    poVar2 = amrex::OutStream();
    amrex::Print::Print(&local_190,poVar2);
    std::operator<<((ostream *)&local_190.ss,"divu must be 0-th Divu_Type component in the state\n")
    ;
    amrex::Print::~Print(&local_190);
    amrex::Abort_host("NavierStokesBase::init_additional_state_types()");
  }
  _Dsdt = -1;
  have_dsdt = 0;
  std::__cxx11::string::string((string *)&local_190,"dsdt",&local_19d);
  bVar1 = amrex::AmrLevel::isStateVariable((string *)&local_190,&dummy_Dsdt_Type,&_Dsdt);
  have_dsdt = (int)bVar1;
  std::__cxx11::string::~string((string *)&local_190);
  have_dsdt = (int)(dummy_Dsdt_Type == Dsdt_Type && have_dsdt != 0);
  if (verbose != 0) {
    poVar2 = amrex::OutStream();
    amrex::Print::Print(&local_190,poVar2);
    std::operator<<((ostream *)&local_190.ss,
                    "NavierStokesBase::init_additional_state_types()::have_dsdt = ");
    pPVar3 = amrex::Print::operator<<(&local_190,&have_dsdt);
    std::operator<<((ostream *)&pPVar3->ss,'\n');
    amrex::Print::~Print(&local_190);
  }
  if ((have_dsdt != 0) && (_Dsdt != 0)) {
    poVar2 = amrex::OutStream();
    amrex::Print::Print(&local_190,poVar2);
    std::operator<<((ostream *)&local_190.ss,"dsdt must be 0-th Dsdt_Type component in the state\n")
    ;
    amrex::Print::~Print(&local_190);
    amrex::Abort_host("NavierStokesBase::init_additional_state_types()");
  }
  if ((have_dsdt != 0) && (have_divu == 0)) {
    poVar2 = amrex::OutStream();
    amrex::Print::Print(&local_190,poVar2);
    std::operator<<((ostream *)&local_190.ss,"Must have divu in order to have dsdt\n");
    amrex::Print::~Print(&local_190);
    amrex::Abort_host("NavierStokesBase::init_additional_state_types()");
  }
  num_state_type = amrex::DescriptorList::size((DescriptorList *)amrex::AmrLevel::desc_lst);
  if ((verbose != 0) && (*(int *)(amrex::ParallelContext::frames + 0xc) == 0)) {
    poVar2 = amrex::OutStream();
    amrex::Print::Print(&local_190,poVar2);
    std::operator<<((ostream *)&local_190.ss,
                    "NavierStokesBase::init_additional_state_types: num_state_type = ");
    pPVar3 = amrex::Print::operator<<(&local_190,&num_state_type);
    std::operator<<((ostream *)&pPVar3->ss,'\n');
    amrex::Print::~Print(&local_190);
  }
  return;
}

Assistant:

void
NavierStokesBase::init_additional_state_types ()
{
    additional_state_types_initialized = 1;
    //
    // Set "Temp" from user's variable setup.
    //
    int dummy_State_Type;
    int have_temp = isStateVariable("temp", dummy_State_Type, Temp);
    have_temp &= (dummy_State_Type == State_Type);
    AMREX_ASSERT((do_temp && have_temp)  ||  (!do_temp && !have_temp));

    int _Divu = -1;
    int dummy_Divu_Type;
    have_divu = 0;
    have_divu = isStateVariable("divu", dummy_Divu_Type, _Divu);
    have_divu = have_divu && dummy_Divu_Type == Divu_Type;
    if (verbose)
    {
        amrex::Print() << "NavierStokesBase::init_additional_state_types()::have_divu = "
                  << have_divu << '\n';
    }
    if (have_divu && _Divu!=Divu)
    {
        amrex::Print() << "divu must be 0-th Divu_Type component in the state\n";
        amrex::Abort("NavierStokesBase::init_additional_state_types()");
    }

    int _Dsdt = -1;
    int dummy_Dsdt_Type;
    have_dsdt = 0;
    have_dsdt = isStateVariable("dsdt", dummy_Dsdt_Type, _Dsdt);
    have_dsdt = have_dsdt && dummy_Dsdt_Type==Dsdt_Type;
    if (verbose)
    {
        amrex::Print() << "NavierStokesBase::init_additional_state_types()::have_dsdt = "
                       << have_dsdt << '\n';
    }
    if (have_dsdt && _Dsdt!=Dsdt)
    {
        amrex::Print() << "dsdt must be 0-th Dsdt_Type component in the state\n";
        amrex::Abort("NavierStokesBase::init_additional_state_types()");
    }
    if (have_dsdt && !have_divu)
    {
        amrex::Print() << "Must have divu in order to have dsdt\n";
        amrex::Abort("NavierStokesBase::init_additional_state_types()");
    }

    num_state_type = desc_lst.size();
    if (verbose && ParallelDescriptor::IOProcessor())
    {
        amrex::Print() << "NavierStokesBase::init_additional_state_types: num_state_type = "
                       << num_state_type << '\n';
    }
}